

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

ENetHost *
enet_host_create(ENetAddress *address,size_t peerCount,size_t channelLimit,
                uint32_t incomingBandwidth,uint32_t outgoingBandwidth,int bufferSize)

{
  undefined2 uVar1;
  ENetSocket EVar2;
  int iVar3;
  ENetPeer *pEVar4;
  uint64_t uVar5;
  ENetPeer *pEStack_48;
  int bindResult;
  ENetPeer *currentPeer;
  ENetHost *host;
  int bufferSize_local;
  uint32_t outgoingBandwidth_local;
  uint32_t incomingBandwidth_local;
  size_t channelLimit_local;
  size_t peerCount_local;
  ENetAddress *address_local;
  
  if (peerCount < 0x1000) {
    address_local = (ENetAddress *)enet_malloc(0x2b10);
    if ((_ENetHost *)address_local == (_ENetHost *)0x0) {
      address_local = (ENetAddress *)0x0;
    }
    else {
      memset(address_local,0,0x2b10);
      pEVar4 = (ENetPeer *)enet_malloc(peerCount * 0x1e8);
      ((_ENetHost *)address_local)->peers = pEVar4;
      if (((_ENetHost *)address_local)->peers == (ENetPeer *)0x0) {
        enet_free(address_local);
        address_local = (ENetAddress *)0x0;
      }
      else {
        memset(((_ENetHost *)address_local)->peers,0,peerCount * 0x1e8);
        EVar2 = enet_socket_create(ENET_SOCKET_TYPE_DATAGRAM);
        ((_ENetHost *)address_local)->socket = EVar2;
        if (((_ENetHost *)address_local)->socket != -1) {
          enet_socket_set_option(((_ENetHost *)address_local)->socket,ENET_SOCKOPT_IPV6_V6ONLY,0);
        }
        iVar3 = enet_socket_bind(((_ENetHost *)address_local)->socket,address);
        if ((((_ENetHost *)address_local)->socket == -1) ||
           ((address != (ENetAddress *)0x0 && (iVar3 < 0)))) {
          if (((_ENetHost *)address_local)->socket != -1) {
            enet_socket_destroy(((_ENetHost *)address_local)->socket);
          }
          enet_free(((_ENetHost *)address_local)->peers);
          enet_free(address_local);
          address_local = (ENetAddress *)0x0;
        }
        else {
          if (bufferSize < 0x100001) {
            host._4_4_ = bufferSize;
            if (bufferSize < 0x40000) {
              host._4_4_ = 0x40000;
            }
          }
          else {
            host._4_4_ = 0x100000;
          }
          enet_socket_set_option(((_ENetHost *)address_local)->socket,ENET_SOCKOPT_NONBLOCK,1);
          enet_socket_set_option(((_ENetHost *)address_local)->socket,ENET_SOCKOPT_BROADCAST,1);
          enet_socket_set_option
                    (((_ENetHost *)address_local)->socket,ENET_SOCKOPT_RCVBUF,host._4_4_);
          enet_socket_set_option
                    (((_ENetHost *)address_local)->socket,ENET_SOCKOPT_SNDBUF,host._4_4_);
          if ((address != (ENetAddress *)0x0) &&
             (iVar3 = enet_socket_get_address
                                (((_ENetHost *)address_local)->socket,
                                 &((_ENetHost *)address_local)->address), iVar3 < 0)) {
            *(undefined8 *)&(((_ENetHost *)address_local)->address).field_0 =
                 *(undefined8 *)&address->field_0;
            *(undefined8 *)((long)&(((_ENetHost *)address_local)->address).field_0 + 8) =
                 *(undefined8 *)((long)&address->field_0 + 8);
            uVar1 = *(undefined2 *)&address->field_0x12;
            (((_ENetHost *)address_local)->address).port = address->port;
            *(undefined2 *)&(((_ENetHost *)address_local)->address).field_0x12 = uVar1;
          }
          if ((channelLimit == 0) || (0xff < channelLimit)) {
            _outgoingBandwidth_local = 0xff;
          }
          else {
            _outgoingBandwidth_local = channelLimit;
            if (channelLimit == 0) {
              _outgoingBandwidth_local = 1;
            }
          }
          ((_ENetHost *)address_local)->randomSeed = (uint32_t)address_local;
          uVar5 = enet_host_random_seed();
          ((_ENetHost *)address_local)->randomSeed =
               ((_ENetHost *)address_local)->randomSeed + (int)uVar5;
          ((_ENetHost *)address_local)->randomSeed =
               ((_ENetHost *)address_local)->randomSeed << 0x10 |
               ((_ENetHost *)address_local)->randomSeed >> 0x10;
          ((_ENetHost *)address_local)->channelLimit = _outgoingBandwidth_local;
          ((_ENetHost *)address_local)->incomingBandwidth = incomingBandwidth;
          ((_ENetHost *)address_local)->outgoingBandwidth = outgoingBandwidth;
          ((_ENetHost *)address_local)->bandwidthThrottleEpoch = 0;
          ((_ENetHost *)address_local)->recalculateBandwidthLimits = 0;
          ((_ENetHost *)address_local)->preventConnections = '\0';
          ((_ENetHost *)address_local)->mtu = 0x500;
          ((_ENetHost *)address_local)->peerCount = peerCount;
          ((_ENetHost *)address_local)->commandCount = 0;
          ((_ENetHost *)address_local)->bufferCount = 0;
          ((_ENetHost *)address_local)->checksumCallback = (ENetChecksumCallback)0x0;
          *(undefined8 *)&(((_ENetHost *)address_local)->receivedAddress).field_0 = _in6addr_any;
          *(undefined8 *)((long)&(((_ENetHost *)address_local)->receivedAddress).field_0 + 8) =
               _setsockopt;
          (((_ENetHost *)address_local)->receivedAddress).port = 0;
          ((_ENetHost *)address_local)->receivedData = (uint8_t *)0x0;
          ((_ENetHost *)address_local)->receivedDataLength = 0;
          ((_ENetHost *)address_local)->totalSentData = 0;
          ((_ENetHost *)address_local)->totalSentPackets = 0;
          ((_ENetHost *)address_local)->totalReceivedData = 0;
          ((_ENetHost *)address_local)->totalReceivedPackets = 0;
          ((_ENetHost *)address_local)->connectedPeers = 0;
          ((_ENetHost *)address_local)->bandwidthLimitedPeers = 0;
          ((_ENetHost *)address_local)->duplicatePeers = 0xfff;
          ((_ENetHost *)address_local)->maximumPacketSize = 0x2000000;
          ((_ENetHost *)address_local)->maximumWaitingData = 0x2000000;
          ((_ENetHost *)address_local)->interceptCallback = (ENetInterceptCallback)0x0;
          enet_list_clear(&((_ENetHost *)address_local)->dispatchQueue);
          for (pEStack_48 = ((_ENetHost *)address_local)->peers;
              pEStack_48 <
              ((_ENetHost *)address_local)->peers + ((_ENetHost *)address_local)->peerCount;
              pEStack_48 = pEStack_48 + 1) {
            pEStack_48->host = (_ENetHost *)address_local;
            pEStack_48->incomingPeerID =
                 (uint16_t)(((long)pEStack_48 - (long)((_ENetHost *)address_local)->peers) / 0x1e8);
            pEStack_48->incomingSessionID = 0xff;
            pEStack_48->outgoingSessionID = 0xff;
            pEStack_48->data = (void *)0x0;
            enet_list_clear(&pEStack_48->acknowledgements);
            enet_list_clear(&pEStack_48->sentReliableCommands);
            enet_list_clear(&pEStack_48->sentUnreliableCommands);
            enet_list_clear(&pEStack_48->outgoingCommands);
            enet_list_clear(&pEStack_48->dispatchedCommands);
            enet_peer_reset(pEStack_48);
          }
        }
      }
    }
  }
  else {
    address_local = (ENetAddress *)0x0;
  }
  return (ENetHost *)address_local;
}

Assistant:

ENetHost* enet_host_create(const ENetAddress* address, size_t peerCount, size_t channelLimit, uint32_t incomingBandwidth, uint32_t outgoingBandwidth, int bufferSize) {
	ENetHost* host;
	ENetPeer* currentPeer;

	ENET_LOG_TRACE("Creating ENet host object.");

	if (peerCount > ENET_PROTOCOL_MAXIMUM_PEER_ID) {
		ENET_LOG_ERROR("Creation failure: Peer count greater than maximum allowed (%u)", ENET_PROTOCOL_MAXIMUM_PEER_ID);
		return NULL;
	}

	host = (ENetHost*)enet_malloc(sizeof(ENetHost));

	if (host == NULL) {
		ENET_LOG_ERROR("Creation failure: Memory allocation failure. Wanted %u bytes", sizeof(ENetHost));
		return NULL;
	}

	memset(host, 0, sizeof(ENetHost));

	host->peers = (ENetPeer*)enet_malloc(peerCount * sizeof(ENetPeer));

	if (host->peers == NULL) {
		ENET_LOG_ERROR("Creation failure: Peer array memory allocation failure. Wanted %u bytes", peerCount * sizeof(ENetHost));
		enet_free(host);

		return NULL;
	}

	memset(host->peers, 0, peerCount * sizeof(ENetPeer));

	host->socket = enet_socket_create(ENET_SOCKET_TYPE_DATAGRAM);

	if (host->socket != ENET_SOCKET_NULL) {
		ENET_LOG_TRACE("Socket creation: IPv4 & IPv6 dual stack mode");
		enet_socket_set_option(host->socket, ENET_SOCKOPT_IPV6_V6ONLY, 0);
	}

	int bindResult = enet_socket_bind(host->socket, address);

	if (host->socket == ENET_SOCKET_NULL || (address != NULL && bindResult < 0)) {
		if (host->socket != ENET_SOCKET_NULL) {
			ENET_LOG_TRACE("Socket creation: Cleaning up a old socket.");
			enet_socket_destroy(host->socket);
		}

		ENET_LOG_ERROR("Socket creation: Binding to socket failed with error code %i", bindResult);
		enet_free(host->peers);
		enet_free(host);

		return NULL;
	}

	ENET_LOG_TRACE("Buffers: Setting up");
	if (bufferSize > ENET_HOST_BUFFER_SIZE_MAX)
		bufferSize = ENET_HOST_BUFFER_SIZE_MAX;
	else if (bufferSize < ENET_HOST_BUFFER_SIZE_MIN)
		bufferSize = ENET_HOST_BUFFER_SIZE_MIN;

	ENET_LOG_TRACE("Socket: Setting up options");
	enet_socket_set_option(host->socket, ENET_SOCKOPT_NONBLOCK, 1);
	enet_socket_set_option(host->socket, ENET_SOCKOPT_BROADCAST, 1);
	enet_socket_set_option(host->socket, ENET_SOCKOPT_RCVBUF, bufferSize);
	enet_socket_set_option(host->socket, ENET_SOCKOPT_SNDBUF, bufferSize);

	ENET_LOG_TRACE("Address: Setting up");
	if (address != NULL && enet_socket_get_address(host->socket, &host->address) < 0)
		host->address = *address;

	ENET_LOG_TRACE("Channels: Setting up");
	if (!channelLimit || channelLimit > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
		channelLimit = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;
	else if (channelLimit < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
		channelLimit = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;

	host->randomSeed = (uint32_t)(size_t)host;
	host->randomSeed += enet_host_random_seed();
	host->randomSeed = (host->randomSeed << 16) | (host->randomSeed >> 16);
	host->channelLimit = channelLimit;
	host->incomingBandwidth = incomingBandwidth;
	host->outgoingBandwidth = outgoingBandwidth;
	host->bandwidthThrottleEpoch = 0;
	host->recalculateBandwidthLimits = 0;
	host->preventConnections = 0;
	host->mtu = ENET_HOST_DEFAULT_MTU;
	host->peerCount = peerCount;
	host->commandCount = 0;
	host->bufferCount = 0;
	host->checksumCallback = NULL;
	host->receivedAddress.ipv6 = ENET_HOST_ANY;
	host->receivedAddress.port = 0;
	host->receivedData = NULL;
	host->receivedDataLength = 0;
	host->totalSentData = 0;
	host->totalSentPackets = 0;
	host->totalReceivedData = 0;
	host->totalReceivedPackets = 0;
	host->connectedPeers = 0;
	host->bandwidthLimitedPeers = 0;
	host->duplicatePeers = ENET_PROTOCOL_MAXIMUM_PEER_ID;
	host->maximumPacketSize = ENET_HOST_DEFAULT_MAXIMUM_PACKET_SIZE;
	host->maximumWaitingData = ENET_HOST_DEFAULT_MAXIMUM_WAITING_DATA;
	host->interceptCallback = NULL;

	ENET_LOG_TRACE("Startup: Clearing queues");
	enet_list_clear(&host->dispatchQueue);

	for (currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
		currentPeer->host = host;
		currentPeer->incomingPeerID = currentPeer - host->peers;
		currentPeer->outgoingSessionID = currentPeer->incomingSessionID = 0xFF;
		currentPeer->data = NULL;

		enet_list_clear(&currentPeer->acknowledgements);
		enet_list_clear(&currentPeer->sentReliableCommands);
		enet_list_clear(&currentPeer->sentUnreliableCommands);
		enet_list_clear(&currentPeer->outgoingCommands);
		enet_list_clear(&currentPeer->dispatchedCommands);
		enet_peer_reset(currentPeer);
	}

	ENET_LOG_TRACE("Startup: Complete. Let's do this.");
	return host;
}